

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<char,char>,phmap::Hash<char>,phmap::EqualTo<char>,std::allocator<std::pair<char_const,char>>>
::
emplace_decomposable<char,std::piecewise_construct_t_const&,std::tuple<char_const&>,std::tuple<char_const&>>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
           *this,char *key,size_t hashval,piecewise_construct_t *args,tuple<const_char_&> *args_1,
          tuple<const_char_&> *args_2)

{
  unsigned_long uVar1;
  size_t in_RCX;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
  *in_RSI;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
  *in_RDI;
  pair<unsigned_long,_bool> pVar2;
  size_t in_stack_00000010;
  char *in_stack_00000018;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
  *in_stack_00000020;
  pair<unsigned_long,_bool> res;
  size_t in_stack_ffffffffffffff88;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
  *args_1_00;
  iterator in_stack_ffffffffffffffa8;
  bool local_30 [24];
  size_t local_18;
  
  args_1_00 = in_RDI;
  local_18 = in_RCX;
  pVar2 = raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
          ::find_or_prepare_insert<char>(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  uVar1 = pVar2.first;
  local_30[0] = pVar2.second;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    emplace_at<std::piecewise_construct_t_const&,std::tuple<char_const&>,std::tuple<char_const&>>
              ((raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
                *)in_stack_ffffffffffffffa8.field_1.slot_,(size_t)in_stack_ffffffffffffffa8.ctrl_,
               (piecewise_construct_t *)in_RSI,(tuple<const_char_&> *)args_1_00,
               (tuple<const_char_&> *)in_RDI);
    H2(local_18);
    raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
    ::set_ctrl(in_RSI,(size_t)args_1_00,(ctrl_t)((ulong)in_RDI >> 0x38));
    in_stack_ffffffffffffff88 = uVar1;
  }
  raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
  ::iterator_at(in_RDI,in_stack_ffffffffffffff88);
  std::
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>::iterator,_bool>
  ::
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>::iterator,_bool_&,_true>
            ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>::iterator,_bool>
              *)in_RDI,(iterator *)&stack0xffffffffffffffa8,local_30);
  return (pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>::iterator,_bool>
          *)args_1_00;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable(const K& key, size_t hashval,
			        Args&&... args)
			{
				auto res = find_or_prepare_insert(key, hashval);
				if (res.second) {
					emplace_at(res.first, std::forward<Args>(args)...);
					this->set_ctrl(res.first, H2(hashval));
				}
				return {iterator_at(res.first), res.second};
			}